

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O3

void fdsocket_select_result_input_error(int fd,int event)

{
  void *e;
  ssize_t sVar1;
  char buf [20480];
  int in_stack_ffffffffffffafec;
  int local_500c;
  undefined1 local_5008 [20480];
  
  local_500c = fd;
  e = find234(fdsocket_by_inerrfd,&local_500c,fdsocket_inerrfd_find);
  if (e != (void *)0x0) {
    sVar1 = read(local_500c,local_5008,0x5000);
    if ((int)(uint)sVar1 < 1) {
      del234(fdsocket_by_inerrfd,e);
      uxsel_del(in_stack_ffffffffffffafec);
      close(*(int *)((long)e + 8));
      *(undefined4 *)((long)e + 8) = 0xffffffff;
    }
    else {
      log_proxy_stderr(*(Plug **)((long)e + 0x2088),(ProxyStderrBuf *)((long)e + 0x68),local_5008,
                       (ulong)((uint)sVar1 & 0x7fffffff));
    }
  }
  return;
}

Assistant:

static void fdsocket_select_result_input_error(int fd, int event)
{
    FdSocket *fds;
    char buf[20480];
    int retd;

    if (!(fds = find234(fdsocket_by_inerrfd, &fd, fdsocket_inerrfd_find)))
        return;

    retd = read(fd, buf, sizeof(buf));
    if (retd > 0) {
        log_proxy_stderr(fds->plug, &fds->psb, buf, retd);
    } else {
        del234(fdsocket_by_inerrfd, fds);
        uxsel_del(fds->inerrfd);
        close(fds->inerrfd);
        fds->inerrfd = -1;
    }
}